

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O1

int randomx_argon2_initialize(argon2_instance_t *instance,argon2_context *context)

{
  int iVar1;
  uint8_t blockhash [72];
  uint8_t auStack_58 [72];
  
  iVar1 = -0x19;
  if (context != (argon2_context *)0x0 && instance != (argon2_instance_t *)0x0) {
    instance->context_ptr = context;
    rxa2_initial_hash(auStack_58,context,instance->type);
    rxa2_fill_first_blocks(auStack_58,instance);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int randomx_argon2_initialize(argon2_instance_t *instance, argon2_context *context) {
	uint8_t blockhash[ARGON2_PREHASH_SEED_LENGTH];
	int result = ARGON2_OK;

	if (instance == NULL || context == NULL)
		return ARGON2_INCORRECT_PARAMETER;
	instance->context_ptr = context;

	/* 1. Memory allocation */
	//RandomX takes care of memory allocation

	/* 2. Initial hashing */
	/* H_0 + 8 extra bytes to produce the first blocks */
	/* uint8_t blockhash[ARGON2_PREHASH_SEED_LENGTH]; */
	/* Hashing all inputs */
	rxa2_initial_hash(blockhash, context, instance->type);
	/* Zeroing 8 extra bytes */
	/*rxa2_clear_internal_memory(blockhash + ARGON2_PREHASH_DIGEST_LENGTH,
		ARGON2_PREHASH_SEED_LENGTH -
		ARGON2_PREHASH_DIGEST_LENGTH);*/

	/* 3. Creating first blocks, we always have at least two blocks in a slice
	 */
	rxa2_fill_first_blocks(blockhash, instance);

	return ARGON2_OK;
}